

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceMatrix4x4.cpp
# Opt level: O3

float __thiscall IceMaths::Matrix4x4::Determinant(Matrix4x4 *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar1 = this->m[2][2];
  fVar2 = this->m[1][0];
  fVar3 = this->m[1][1];
  fVar4 = this->m[1][2];
  fVar5 = this->m[3][1];
  fVar6 = this->m[3][0];
  uVar10 = *(undefined8 *)(this->m[1] + 3);
  fVar7 = this->m[3][3];
  fVar12 = (float)uVar10;
  fVar13 = (float)((ulong)uVar10 >> 0x20);
  fVar8 = this->m[2][3];
  fVar9 = this->m[3][2];
  fVar11 = this->m[2][1];
  return (((fVar8 * fVar3 * fVar6 + fVar5 * fVar13 * fVar12 + fVar7 * fVar11 * fVar2) -
          (fVar5 * fVar8 * fVar2 + fVar3 * fVar7 * fVar13 + fVar12 * fVar11 * fVar6)) *
          this->m[0][2] +
         (((fVar12 * fVar11 * fVar9 + fVar1 * fVar3 * fVar7 + fVar8 * fVar4 * fVar5) -
          (fVar7 * fVar11 * fVar4 + fVar5 * fVar1 * fVar12 + fVar8 * fVar9 * fVar3)) * this->m[0][0]
         - ((fVar1 * fVar2 * fVar7 + fVar8 * fVar4 * fVar6 + fVar9 * fVar13 * fVar12) -
           (fVar1 * fVar6 * fVar12 + fVar8 * fVar9 * fVar2 + fVar4 * fVar7 * fVar13)) *
           this->m[0][1])) -
         ((fVar4 * fVar13 * fVar5 + fVar11 * fVar2 * fVar9 + fVar6 * fVar1 * fVar3) -
         (fVar9 * fVar13 * fVar3 + fVar11 * fVar6 * fVar4 + fVar2 * fVar5 * fVar1)) * this->m[0][3];
}

Assistant:

float Matrix4x4::CoFactor(udword row, udword col) const
{
	return	 (( m[(row+1)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+3)&3][(col+3)&3] +
				m[(row+1)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+3)&3][(col+1)&3] +
				m[(row+1)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+3)&3][(col+2)&3])
			-  (m[(row+3)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+1)&3][(col+3)&3] +
				m[(row+3)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+1)&3][(col+1)&3] +
				m[(row+3)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+1)&3][(col+2)&3])) * ((row + col) & 1 ? -1.0f : +1.0f);
}